

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserDeleteView.cpp
# Opt level: O2

void __thiscall UserDeleteView::display(UserDeleteView *this)

{
  bool bVar1;
  BaseUser *pBVar2;
  Application *this_00;
  BaseUser *this_01;
  char *__lhs;
  ostream *poVar3;
  Controller *this_02;
  View *pVVar4;
  string email;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::operator<<((ostream *)&std::cout,"Enter the email of user to delete: ");
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  Input::getEmail_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_38,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pBVar2 = BaseUser::findByEmail(&local_38);
  if (pBVar2 == (BaseUser *)0x0) {
    std::operator<<((ostream *)&std::cout,"No user with this email exists.\n");
  }
  else {
    this_00 = Application::getInstance();
    this_01 = Application::getCurrentUser(this_00);
    __lhs = BaseUser::getEmail(this_01);
    bVar1 = std::operator==(__lhs,&local_38);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"You cannot delete yourself!");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      (this->super_DeleteView<BaseUser>).super_View.context.requestObjectId =
           (pBVar2->super_Model<BaseUser>).id;
      DeleteView<BaseUser>::display(&this->super_DeleteView<BaseUser>);
    }
  }
  this_02 = Controller::getInstance();
  std::__cxx11::string::string((string *)&local_58,"admin-panel",&local_59);
  pVVar4 = Controller::getView(this_02,&local_58);
  View::response->view = pVVar4;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void UserDeleteView::display() {
    cout << "Enter the email of user to delete: ";
    string email;
    email = Input::getEmail();
    BaseUser *user = BaseUser::findByEmail(email);
    if (!user) {
        cout << "No user with this email exists.\n";
    }
    else if (Application::getInstance().getCurrentUser()->getEmail() == email)
        cout << "You cannot delete yourself!" << endl;
    else {
        context.requestObjectId = user->getId();
        DeleteView::display();
    }
    response->view = Controller::getInstance().getView("admin-panel");
}